

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O2

ActionResults * __thiscall WhiteRoomOneAction::Go(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  string *this_02;
  itemType local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == LADDER) {
    local_7c = LADDER;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_7c);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 != HIDDEN) {
      this_01 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,"You climb down the ladder",(allocator *)&local_7c);
      ActionResults::ActionResults(this_01,W_ROOM2,&local_38);
      this_02 = &local_38;
      goto LAB_0011ebaf;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  this_01 = (ActionResults *)operator_new(0x30);
  if (iVar1 == LIGHT) {
    std::__cxx11::string::string
              ((string *)&local_58,"You feel warmer, more content on where your life is going.",
               (allocator *)&local_7c);
    ActionResults::ActionResults(this_01,CURRENT,&local_58);
    this_02 = &local_58;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_78,"You don\'t go anywhere",(allocator *)&local_7c);
    ActionResults::ActionResults(this_01,CURRENT,&local_78);
    this_02 = &local_78;
  }
LAB_0011ebaf:
  std::__cxx11::string::~string((string *)this_02);
  return this_01;
}

Assistant:

ActionResults *WhiteRoomOneAction::Go() {
    if(commands->getMainItem() == LADDER && itemList->getValue(LADDER)->getLocation() != HIDDEN) {
        return new ActionResults(W_ROOM2, "You climb down the ladder");
    } else if(commands->getMainItem() == LIGHT){
        return new ActionResults(CURRENT, "You feel warmer, more content on where your life is going.");
    }
    else {
        return new ActionResults(CURRENT, "You don't go anywhere");
    }
}